

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void min_w_cb(Fl_Value_Input *i,void *v)

{
  bool bVar1;
  int iVar2;
  Fl_Group *pFVar3;
  double dVar4;
  Fl_Type *local_28;
  Fl_Type *o;
  int n;
  int mod;
  void *v_local;
  Fl_Value_Input *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar2 == 0) {
      pFVar3 = Fl_Widget::parent((Fl_Widget *)i);
      (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[6])();
    }
    else {
      pFVar3 = Fl_Widget::parent((Fl_Widget *)i);
      (*(pFVar3->super_Fl_Widget)._vptr_Fl_Widget[5])();
      Fl_Valuator::value(&i->super_Fl_Valuator,(double)current_widget[1].super_Fl_Type.level);
    }
  }
  else {
    bVar1 = false;
    dVar4 = Fl_Valuator::value(&i->super_Fl_Valuator);
    for (local_28 = Fl_Type::first; local_28 != (Fl_Type *)0x0; local_28 = local_28->next) {
      if ((local_28->selected != '\0') && (iVar2 = (*local_28->_vptr_Fl_Type[0x21])(), iVar2 != 0))
      {
        current_widget[1].super_Fl_Type.level = (int)dVar4;
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void min_w_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->parent()->hide(); return;}
    i->parent()->show();
    i->value(((Fl_Window_Type*)current_widget)->sr_min_w);
  } else {
    int mod = 0;
    int n = (int)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        ((Fl_Window_Type*)current_widget)->sr_min_w = n;
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}